

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::VarDuplicated::to_string_abi_cxx11_(string *__return_storage_ptr__,VarDuplicated *this)

{
  VarType VVar1;
  element_type *peVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  bool bVar3;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_1f0;
  __node_base local_1d0 [4];
  uint local_1ac;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_1a8;
  string local_178 [32];
  undefined1 local_158 [8];
  shared_ptr<kratos::Expr> expr;
  VarDuplicated *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [48];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  pointer local_c0;
  basic_string_view<char> local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  __node_base *local_70;
  pointer local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  __node_base local_50;
  element_type *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  element_type *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  __node_base local_18;
  __node_base local_10;
  
  expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  VVar1 = Var::type((this->super_Expr).left);
  if (VVar1 == Expression) {
    Var::as<kratos::Expr>((Var *)local_158);
    peVar2 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_158);
    bVar3 = peVar2->op == Concat;
    if (bVar3) {
      (*(((this->super_Expr).right)->super_IRNode)._vptr_IRNode[0x1f])(local_178);
      (*(((this->super_Expr).left)->super_IRNode)._vptr_IRNode[0x1f])(&local_1a8);
      local_e0._8_8_ = "{{{0}{1}}}";
      local_e0._0_8_ = local_178;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1a8;
      local_d0._0_8_ = __return_storage_ptr__;
      fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[11],char>
                ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_118,(v7 *)"{{{0}{1}}}",(char (*) [11])local_e0._0_8_,
                 (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,
                 (remove_reference_t<std::__cxx11::basic_string<char>_> *)in_R8.values_);
      local_118._40_8_ = local_118;
      local_128 = (undefined1  [16])fmt::v7::to_string_view<char,_0>((char *)local_e0._8_8_);
      local_40 = &local_138;
      local_48 = (element_type *)local_118._40_8_;
      local_38 = (element_type *)local_118._40_8_;
      local_10._M_nxt = (_Hash_node_base *)local_118._40_8_;
      local_30 = local_40;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_40,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_118._40_8_);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_138.field_1.values_;
      format_str.size_ = local_138.desc_;
      format_str.data_ = (char *)local_128._8_8_;
      fmt::v7::detail::vformat_abi_cxx11_
                (__return_storage_ptr__,(detail *)local_128._0_8_,format_str,args);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string(local_178);
      in_R8 = local_138.field_1;
    }
    local_1ac = (uint)bVar3;
    std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_158);
    if (local_1ac != 0) {
      return __return_storage_ptr__;
    }
  }
  (*(((this->super_Expr).right)->super_IRNode)._vptr_IRNode[0x1f])(local_1d0);
  (*(((this->super_Expr).left)->super_IRNode)._vptr_IRNode[0x1f])(&local_1f0);
  local_68 = (pointer)0x45eab8;
  local_70 = local_1d0;
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1f0;
  local_60 = __return_storage_ptr__;
  fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[15],char>
            (&local_a8,(v7 *)"{{{0}{{{1}}}}}",(char (*) [15])local_70,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)in_R8.values_);
  local_80 = &local_a8;
  local_b8 = fmt::v7::to_string_view<char,_0>((char *)local_68);
  local_50._M_nxt = (_Hash_node_base *)(local_d0 + 8);
  local_58 = local_80;
  local_28 = local_80;
  local_18._M_nxt = (_Hash_node_base *)local_80;
  local_20 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)local_50._M_nxt;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_50._M_nxt,0xdd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_80);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_c0;
  format_str_00.size_ = local_d0._8_8_;
  format_str_00.data_ = (char *)local_b8.size_;
  fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)local_b8.data_,format_str_00,args_00);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)local_1d0);
  return __return_storage_ptr__;
}

Assistant:

std::string VarDuplicated::to_string() const {
    if (left->type() == VarType::Expression) {
        auto expr = left->as<Expr>();
        if (expr->op == ExprOp::Concat) {
            return fmt::format("{{{0}{1}}}", right->to_string(), left->to_string());
        }
    }

    return fmt::format("{{{0}{{{1}}}}}", right->to_string(), left->to_string());
}